

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_get_format_string(bcf_hdr_t *hdr,bcf1_t *line,char *tag,char ***dst,int *ndst)

{
  uint uVar1;
  int iVar2;
  bcf_fmt_t *pbVar3;
  uint uVar4;
  char **ppcVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  size_t __size;
  
  uVar4 = bcf_hdr_id2int(hdr,0,tag);
  iVar10 = -1;
  if ((-1 < (int)uVar4) && (uVar1 = (hdr->id[0][uVar4].val)->info[2], (~uVar1 & 0xf) != 0)) {
    if ((uVar1 & 0xf0) == 0x30) {
      if ((line->unpacked & 8) == 0) {
        bcf_unpack(line,8);
      }
      iVar10 = -3;
      for (lVar7 = 0; (ulong)(byte)line->field_0x14 << 5 != lVar7; lVar7 = lVar7 + 0x20) {
        if (*(uint *)((long)&((line->d).fmt)->id + lVar7) == uVar4) {
          if ((uint)(byte)line->field_0x14 << 5 == (int)lVar7) {
            return -3;
          }
          pbVar3 = (line->d).fmt;
          uVar4 = hdr->n[2];
          ppcVar5 = *dst;
          if (ppcVar5 == (char **)0x0) {
            ppcVar5 = (char **)malloc((long)(int)uVar4 * 8);
            *dst = ppcVar5;
            if (ppcVar5 == (char **)0x0) {
              return -4;
            }
            *ppcVar5 = (char *)0x0;
          }
          __size = ((long)*(int *)((long)&pbVar3->n + lVar7) + 1) * (long)(int)uVar4;
          iVar10 = (int)__size;
          if (*ndst < iVar10) {
            pcVar6 = (char *)realloc(*ppcVar5,__size);
            **dst = pcVar6;
            if (**dst == (char *)0x0) {
              return -4;
            }
            *ndst = iVar10;
          }
          uVar8 = 0;
          uVar9 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar9 = uVar8;
          }
          for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
            iVar2 = *(int *)((long)&pbVar3->n + lVar7);
            pcVar6 = **dst + (iVar2 + 1) * (int)uVar8;
            memcpy(pcVar6,(void *)((long)(iVar2 * (int)uVar8) + *(long *)((long)&pbVar3->p + lVar7))
                   ,(long)iVar2);
            pcVar6[*(int *)((long)&pbVar3->n + lVar7)] = '\0';
            (*dst)[uVar8] = pcVar6;
          }
          return iVar10;
        }
      }
    }
    else {
      iVar10 = -2;
    }
  }
  return iVar10;
}

Assistant:

int bcf_get_format_string(const bcf_hdr_t *hdr, bcf1_t *line, const char *tag, char ***dst, int *ndst)
{
    int i,tag_id = bcf_hdr_id2int(hdr, BCF_DT_ID, tag);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_FMT,tag_id) ) return -1;    // no such FORMAT field in the header
    if ( bcf_hdr_id2type(hdr,BCF_HL_FMT,tag_id)!=BCF_HT_STR ) return -2;     // expected different type

    if ( !(line->unpacked & BCF_UN_FMT) ) bcf_unpack(line, BCF_UN_FMT);

    for (i=0; i<line->n_fmt; i++)
        if ( line->d.fmt[i].id==tag_id ) break;
    if ( i==line->n_fmt ) return -3;                               // the tag is not present in this record
    bcf_fmt_t *fmt = &line->d.fmt[i];

    int nsmpl = bcf_hdr_nsamples(hdr);
    if ( !*dst )
    {
        *dst = (char**) malloc(sizeof(char*)*nsmpl);
        if ( !*dst ) return -4;     // could not alloc
        (*dst)[0] = NULL;
    }
    int n = (fmt->n+1)*nsmpl;
    if ( *ndst < n )
    {
        (*dst)[0] = realloc((*dst)[0], n);
        if ( !(*dst)[0] ) return -4;    // could not alloc
        *ndst = n;
    }
    for (i=0; i<nsmpl; i++)
    {
        uint8_t *src = fmt->p + i*fmt->n;
        uint8_t *tmp = (uint8_t*)(*dst)[0] + i*(fmt->n+1);
        memcpy(tmp,src,fmt->n);
        tmp[fmt->n] = 0;
        (*dst)[i] = (char*) tmp;
    }
    return n;
}